

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false> *this)

{
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false> *this_local;
  
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0013c690;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             (FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->props).super_SerializableProperties,&(this->payload).super_SerializablePayload)
  ;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0013c690;
  FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)10,_(unsigned_char)'\x02'>::
  FixedHeaderType(&this->header);
  FixedField<(Protocol::MQTT::Common::ControlPacketType)10>::FixedField(&this->fixedVariableHeader);
  Properties::Properties(&this->props);
  Payload<(Protocol::MQTT::Common::ControlPacketType)10>::Payload(&this->payload);
  SerializablePayload::setFlags
            (&(this->payload).super_SerializablePayload,
             (FixedFieldGeneric *)&this->fixedVariableHeader);
  FixedFieldGeneric::setFlags
            ((FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->header).super_FixedHeaderBase.typeAndFlags);
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }